

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Symbol_init(void)

{
  s_x2 *__ptr;
  s_x2node *psVar1;
  long lVar2;
  
  if (x2a == (s_x2 *)0x0) {
    __ptr = (s_x2 *)malloc(0x18);
    x2a = __ptr;
    if (__ptr != (s_x2 *)0x0) {
      __ptr->size = 0x80;
      __ptr->count = 0;
      psVar1 = (s_x2node *)calloc(0x80,0x28);
      __ptr->tbl = psVar1;
      if (psVar1 == (s_x2node *)0x0) {
        free(__ptr);
        x2a = (s_x2 *)0x0;
      }
      else {
        __ptr->ht = (s_x2node **)(psVar1 + 0x80);
        lVar2 = 0;
        do {
          __ptr->ht[lVar2] = (s_x2node *)0x0;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x80);
      }
    }
    return;
  }
  return;
}

Assistant:

void Symbol_init(){
  if( x2a ) return;
  x2a = (struct s_x2*)malloc( sizeof(struct s_x2) );
  if( x2a ){
    x2a->size = 128;
    x2a->count = 0;
    x2a->tbl = (x2node*)calloc(128, sizeof(x2node) + sizeof(x2node*));
    if( x2a->tbl==0 ){
      free(x2a);
      x2a = 0;
    }else{
      int i;
      x2a->ht = (x2node**)&(x2a->tbl[128]);
      for(i=0; i<128; i++) x2a->ht[i] = 0;
    }
  }
}